

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O2

int __thiscall Ptex::v2_2::PtexMainWriter::close(PtexMainWriter *this,int __fd)

{
  int iVar1;
  int iVar2;
  char *in_RCX;
  undefined4 in_register_00000034;
  string local_40;
  
  iVar1 = PtexWriterBase::close(&this->super_PtexWriterBase,__fd);
  if (this->_reader != (PtexReader *)0x0) {
    (*(this->_reader->super_PtexTexture)._vptr_PtexTexture[2])();
    this->_reader = (PtexReader *)0x0;
  }
  if ((FILE *)this->_tmpfp != (FILE *)0x0) {
    fclose((FILE *)this->_tmpfp);
    unlink((this->_tmppath)._M_dataplus._M_p);
    this->_tmpfp = (FILE *)0x0;
  }
  if ((char)iVar1 != '\0') {
    iVar1 = (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
    if (this->_hasNewData != true) {
      return iVar1;
    }
    unlink((this->super_PtexWriterBase)._path._M_dataplus._M_p);
    iVar2 = rename((this->_newpath)._M_dataplus._M_p,
                   (this->super_PtexWriterBase)._path._M_dataplus._M_p);
    if (iVar2 != -1) {
      return iVar1;
    }
    (anonymous_namespace)::fileError_abi_cxx11_
              (&local_40,(_anonymous_namespace_ *)"Can\'t write to ptex file: ",
               (this->super_PtexWriterBase)._path._M_dataplus._M_p,in_RCX);
    std::__cxx11::string::assign((char *)CONCAT44(in_register_00000034,__fd));
    std::__cxx11::string::~string((string *)&local_40);
    unlink((this->_newpath)._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

bool PtexMainWriter::close(Ptex::String& error)
{
    // closing base writer will write all pending data via finish() method
    // and will close _fp (which in this case is on the temp disk)
    bool result = PtexWriterBase::close(error);
    if (_reader) {
        _reader->release();
        _reader = 0;
    }
    if (_tmpfp) {
        fclose(_tmpfp);
        unlink(_tmppath.c_str());
        _tmpfp = 0;
    }
    if (result && _hasNewData) {
        // rename temppath into final location
        unlink(_path.c_str());
        if (rename(_newpath.c_str(), _path.c_str()) == -1) {
            error = fileError("Can't write to ptex file: ", _path.c_str()).c_str();
            unlink(_newpath.c_str());
            result = false;
        }
    }
    return result;
}